

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void learn_with_metrics(lda *l,single_learner *base,example *ec)

{
  pointer puVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this;
  single_learner sVar2;
  uint32_t uVar3;
  vw *pvVar4;
  single_learner *psVar5;
  ulong uVar6;
  float *pfVar7;
  iterator __position;
  uint32_t *puVar8;
  ulong uVar9;
  float *pfVar10;
  uint64_t *puVar11;
  ulong *puVar12;
  example *__range2;
  
  pvVar4 = l->all;
  if (pvVar4->passes_complete == 0) {
    puVar11 = &(pvVar4->weights).dense_weights._weight_mask;
    puVar8 = &(pvVar4->weights).dense_weights._stride_shift;
    if ((pvVar4->weights).sparse != false) {
      puVar11 = &(pvVar4->weights).sparse_weights._weight_mask;
      puVar8 = &(pvVar4->weights).sparse_weights._stride_shift;
    }
    base = (single_learner *)(ec->super_example_predict).indices._begin;
    psVar5 = (single_learner *)(ec->super_example_predict).indices._end;
    if (base != psVar5) {
      uVar3 = *puVar8;
      uVar6 = *puVar11;
      do {
        sVar2 = *base;
        pfVar10 = (ec->super_example_predict).feature_space[(byte)sVar2].values._begin;
        pfVar7 = (ec->super_example_predict).feature_space[(byte)sVar2].values._end;
        if (pfVar10 != pfVar7) {
          puVar12 = (ec->super_example_predict).feature_space[(byte)sVar2].indicies._begin;
          do {
            uVar9 = (*puVar12 & uVar6) >> ((byte)uVar3 & 0x3f);
            puVar1 = (l->feature_counts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar9;
            *puVar1 = *puVar1 + (int)(long)*pfVar10;
            this = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   ((l->feature_to_example_map).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar9);
            __position._M_current = *(unsigned_long **)(this + 8);
            if (__position._M_current == *(unsigned_long **)(this + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(this,__position,&ec->example_counter);
            }
            else {
              *__position._M_current = ec->example_counter;
              *(long *)(this + 8) = *(long *)(this + 8) + 8;
            }
            pfVar10 = pfVar10 + 1;
            puVar12 = puVar12 + 1;
          } while (pfVar10 != pfVar7);
        }
        base = base + 1;
      } while (base != psVar5);
    }
  }
  learn(l,base,ec);
  return;
}

Assistant:

void learn_with_metrics(lda &l, LEARNER::single_learner &base, example &ec)
{
  if (l.all->passes_complete == 0)
  {
    // build feature to example map
    uint64_t stride_shift = l.all->weights.stride_shift();
    uint64_t weight_mask = l.all->weights.mask();

    for (features &fs : ec)
    {
      for (features::iterator &f : fs)
      {
        uint64_t idx = (f.index() & weight_mask) >> stride_shift;
        l.feature_counts[idx] += (uint32_t)f.value();
        l.feature_to_example_map[idx].push_back(ec.example_counter);
      }
    }
  }

  learn(l, base, ec);
}